

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O0

bool BicTest3<Blob<88>,Blob<256>>(pfHash hash,int reps,bool verbose)

{
  uint32_t uVar1;
  uint32_t uVar2;
  reference pvVar3;
  int iVar4;
  ulong uVar5;
  byte in_DL;
  int in_ESI;
  code *in_RDI;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool result;
  int i;
  double b2;
  int b_1;
  double bias;
  int *bins_1;
  int *page_1;
  int keybit_1;
  int out2_1;
  int out1_1;
  uint32_t x;
  int *b;
  int out2;
  int out1;
  Blob<256> d;
  int irep;
  int *page;
  int keybit;
  vector<int,_std::allocator<int>_> bins;
  Blob<256> h2;
  Blob<256> h1;
  Blob<88> key;
  int maxB;
  int maxA;
  int maxK;
  double maxBias;
  Rand r;
  int pagesize;
  int hashbits;
  int hashbytes;
  int keybits;
  int keybytes;
  uint32_t in_stack_fffffffffffffe9c;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  byte bVar8;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  Blob<256> *k;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  Rand *in_stack_fffffffffffffec0;
  int local_134;
  double local_130;
  uint local_118;
  uint local_114;
  uint local_110;
  int local_fc;
  int local_f8;
  int local_d4;
  int local_c8;
  undefined1 local_b5 [30];
  Blob<256> local_97;
  Blob<256> local_77;
  Blob<88> local_57;
  uint local_4c;
  uint local_48;
  uint local_44;
  double local_40;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  byte local_d;
  int local_c;
  code *local_8;
  
  local_d = in_DL & 1;
  local_14 = 0xb;
  local_18 = 0x58;
  local_1c = 0x20;
  local_20 = 0x100;
  local_24 = 0x40000;
  local_c = in_ESI;
  local_8 = in_RDI;
  Rand::Rand((Rand *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
             in_stack_fffffffffffffe9c);
  local_40 = 0.0;
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  Blob<88>::Blob(&local_57);
  Blob<256>::Blob(&local_77);
  Blob<256>::Blob(&local_97);
  local_b5[1] = '\0';
  local_b5[2] = '\0';
  local_b5[3] = '\0';
  local_b5[4] = '\0';
  k = (Blob<256> *)local_b5;
  std::allocator<int>::allocator((allocator<int> *)0x19cf1b);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffec0,
             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),(value_type_conflict *)k,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  std::allocator<int>::~allocator((allocator<int> *)0x19cf49);
  for (local_c8 = 0; local_c8 < 0x58; local_c8 = local_c8 + 1) {
    if (local_c8 % 8 == 0) {
      printf(".");
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(local_b5 + 5),(long)(local_c8 << 0x12)
                       );
    for (local_d4 = 0; local_d4 < local_c; local_d4 = local_d4 + 1) {
      Rand::rand_p(in_stack_fffffffffffffec0,
                   (void *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                   (int)((ulong)k >> 0x20));
      (*local_8)(&local_57,0xb,0,&local_77);
      flipbit<Blob<88>>((Blob<88> *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                        in_stack_fffffffffffffe9c);
      (*local_8)(&local_57,0xb,0,&local_97);
      Blob<256>::operator^
                ((Blob<256> *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),k);
      for (local_f8 = 0; local_fc = local_f8, local_f8 < 0xff; local_f8 = local_f8 + 1) {
        while (local_fc = local_fc + 1, local_fc < 0x100) {
          iVar4 = local_f8 * 0x100 + local_fc;
          uVar1 = getbit<Blob<256>>((Blob<256> *)
                                    CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                                    in_stack_fffffffffffffe9c);
          uVar2 = getbit<Blob<256>>((Blob<256> *)
                                    CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                                    in_stack_fffffffffffffe9c);
          uVar5 = (ulong)(uVar1 | uVar2 << 1);
          pvVar3[(long)(iVar4 * 4) + uVar5] = pvVar3[(long)(iVar4 * 4) + uVar5] + 1;
        }
      }
    }
  }
  printf("\n");
  for (local_110 = 0; local_114 = local_110, (int)local_110 < 0xff; local_110 = local_110 + 1) {
    while (local_114 = local_114 + 1, (int)local_114 < 0x100) {
      if ((local_d & 1) != 0) {
        printf("(%3d,%3d) - ",(ulong)local_110,(ulong)local_114);
      }
      for (local_118 = 0; (int)local_118 < 0x58; local_118 = local_118 + 1) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(local_b5 + 5),
                            (long)(int)(local_118 << 0x12));
        local_130 = 0.0;
        for (local_134 = 0; local_134 < 4; local_134 = local_134 + 1) {
          auVar6._8_8_ = 0;
          auVar6._0_8_ = (double)pvVar3[(long)(int)((local_110 * 0x100 + local_114) * 4) +
                                        (long)local_134] / (double)(local_c / 2);
          auVar6 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar6,ZEXT816(0xbff0000000000000));
          auVar7._8_8_ = 0x7fffffffffffffff;
          auVar7._0_8_ = 0x7fffffffffffffff;
          auVar6 = vpand_avx(auVar6,auVar7);
          if (local_130 < auVar6._0_8_) {
            local_130 = auVar6._0_8_;
          }
        }
        if (local_40 < local_130) {
          local_40 = local_130;
          local_44 = local_118;
          local_48 = local_110;
          local_4c = local_114;
        }
        if ((local_d & 1) != 0) {
          if (0.01 <= local_130) {
            if (0.05 <= local_130) {
              if (0.33 <= local_130) {
                printf("X");
              }
              else {
                printf("O");
              }
            }
            else {
              printf("o");
            }
          }
          else {
            printf(".");
          }
        }
      }
      if ((local_d & 1) != 0) {
        printf("\n");
      }
    }
    if ((local_d & 1) != 0) {
      for (iVar4 = 0; iVar4 < 100; iVar4 = iVar4 + 1) {
        printf("-");
      }
      printf("\n");
    }
  }
  printf("Max bias %f - (%3d : %3d,%3d)\n",local_40,(ulong)local_44,(ulong)local_48,(ulong)local_4c)
  ;
  bVar8 = local_40 < 0.05;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)k);
  return (bool)(bVar8 & 1);
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}